

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<double>_>::AddKel
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  long lVar4;
  int64_t iVar5;
  int iVar6;
  Fad<double> *pFVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Fad<double> prevval;
  Fad<double> local_70;
  Fad<double> local_50;
  
  lVar1 = source->fNElements;
  Fad<double>::Fad(&local_70);
  iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
  lVar8 = 0;
  if (0 < lVar1) {
    lVar8 = lVar1;
  }
  if (iVar6 == 0) {
    for (lVar10 = 0; lVar10 != lVar8; lVar10 = lVar10 + 1) {
      lVar2 = destinationindex->fStore[lVar10];
      iVar3 = source->fStore[lVar10];
      for (lVar9 = 0; lVar1 != lVar9; lVar9 = lVar9 + 1) {
        lVar4 = destinationindex->fStore[lVar9];
        iVar5 = source->fStore[lVar9];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,lVar2,lVar4);
        Fad<double>::operator=(&local_70,&local_50);
        Fad<double>::~Fad(&local_50);
        pFVar7 = TPZFMatrix<Fad<double>_>::operator()(elmat,iVar3,iVar5);
        Fad<double>::operator+=<double,_nullptr>(&local_70,pFVar7);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar4,&local_70);
      }
    }
  }
  else {
    for (lVar10 = 0; lVar10 != lVar8; lVar10 = lVar10 + 1) {
      lVar2 = destinationindex->fStore[lVar10];
      iVar3 = source->fStore[lVar10];
      for (lVar9 = lVar10; lVar1 != lVar9; lVar9 = lVar9 + 1) {
        lVar4 = destinationindex->fStore[lVar9];
        iVar5 = source->fStore[lVar9];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,lVar2,lVar4);
        Fad<double>::operator=(&local_70,&local_50);
        Fad<double>::~Fad(&local_50);
        pFVar7 = TPZFMatrix<Fad<double>_>::operator()(elmat,iVar3,iVar5);
        Fad<double>::operator+=<double,_nullptr>(&local_70,pFVar7);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar4,&local_70);
      }
    }
  }
  Fad<double>::~Fad(&local_70);
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}